

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::BuildSystemInvocation::parse
          (BuildSystemInvocation *this,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          args,SourceMgr *sourceMgr)

{
  size_type *psVar1;
  short *psVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  undefined8 *puVar8;
  SchedulerAlgorithm SVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type sVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  char *__lhs;
  string *psVar12;
  iterator __begin3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x_00;
  size_type sVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> algorithm;
  char *end;
  char *end_1;
  Child local_128;
  long local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  SourceMgr *local_e0;
  Child local_d8;
  long local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  Child local_b8;
  undefined8 uStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  char *local_70;
  Child local_68;
  undefined8 uStack_60;
  undefined8 local_48;
  undefined8 uStack_40;
  
  sVar11 = args.Length;
  __x = args.Data;
  if (sVar11 != 0) {
    local_88 = (string *)&this->traceFilePath;
    local_80 = (string *)&this->buildFilePath;
    local_78 = (string *)&this->chdirPath;
    local_90 = (string *)&this->dbPath;
    local_e0 = sourceMgr;
    do {
      __x_00 = __x + 1;
      iVar5 = std::__cxx11::string::compare((char *)__x);
      if (iVar5 == 0) {
        if (sVar11 * 0x20 == 0x20) {
          return;
        }
        lVar7 = sVar11 * 0x20 + -0x20;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->positionalArgs,__x_00);
          __x_00 = __x_00 + 1;
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != 0);
        return;
      }
      sVar13 = sVar11 - 1;
      if ((__x->_M_string_length == 0) || (*(__x->_M_dataplus)._M_p == '-')) {
        iVar5 = std::__cxx11::string::compare((char *)__x);
        if (iVar5 == 0) {
          this->showUsage = true;
          return;
        }
        iVar5 = std::__cxx11::string::compare((char *)__x);
        if (iVar5 == 0) {
          this->showVersion = true;
          return;
        }
        iVar5 = std::__cxx11::string::compare((char *)__x);
        if (iVar5 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)local_90,0,(char *)(this->dbPath)._M_string_length,0x1aa7eb);
          __x = __x_00;
          sVar11 = sVar13;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)__x);
          psVar12 = local_90;
          if ((((iVar5 == 0) ||
               (iVar5 = std::__cxx11::string::compare((char *)__x), psVar12 = local_78, iVar5 == 0))
              || (iVar5 = std::__cxx11::string::compare((char *)__x), psVar12 = local_78, iVar5 == 0
                 )) || (iVar5 = std::__cxx11::string::compare((char *)__x), psVar12 = local_80,
                       iVar5 == 0)) {
            if (sVar13 == 0) goto LAB_00115eeb;
LAB_00115a51:
            std::__cxx11::string::_M_assign(psVar12);
LAB_00115a59:
            __x = __x + 2;
            sVar11 = sVar11 - 2;
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)__x);
            if (iVar5 == 0) {
              this->useSerialBuild = true;
              __x = __x_00;
              sVar11 = sVar13;
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)__x);
              if (iVar5 == 0) {
                if (sVar13 == 0) {
LAB_00115eeb:
                  std::operator+(&local_108,"missing argument to \'",__x);
                  plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
                  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar6 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar6 == paVar10) {
                    local_118._M_allocated_capacity = paVar10->_M_allocated_capacity;
                    local_118._8_8_ = plVar6[3];
                    local_128.twine = (Twine *)&local_118;
                  }
                  else {
                    local_118._M_allocated_capacity = paVar10->_M_allocated_capacity;
                    local_128.twine = (Twine *)*plVar6;
                  }
                  local_120 = plVar6[1];
                  *plVar6 = (long)paVar10;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  llvm::Twine::Twine((Twine *)&local_d8,(string *)&local_128);
                  local_b8.twine = (Twine *)0x0;
                  uStack_b0 = 0;
                  llvm::SourceMgr::PrintMessage
                            (local_e0,(SMLoc)0x0,DK_Error,(Twine *)&local_d8,
                             (ArrayRef<llvm::SMRange>)ZEXT816(0),(ArrayRef<llvm::SMFixIt>)ZEXT816(0)
                             ,true);
                  this->hadErrors = true;
                  if (local_128.twine == (Twine *)&local_118) goto LAB_00115fbc;
LAB_00115faf:
                  operator_delete(local_128.twine,local_118._M_allocated_capacity + 1);
LAB_00115fbc:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p == &local_108.field_2) {
                    return;
                  }
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                  return;
                }
                local_128.twine = (Twine *)&local_118;
                pcVar3 = __x[1]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_128,pcVar3,pcVar3 + __x[1]._M_string_length);
                iVar5 = std::__cxx11::string::compare(&local_128.character);
                SVar9 = NamePriority;
                if (iVar5 == 0) {
LAB_00115d4f:
                  this->schedulerAlgorithm = SVar9;
                  sVar13 = sVar11 - 2;
                  __x_00 = __x + 2;
                  bVar4 = false;
                }
                else {
                  iVar5 = std::__cxx11::string::compare(&local_128.character);
                  SVar9 = NamePriority;
                  if (iVar5 == 0) goto LAB_00115d4f;
                  iVar5 = std::__cxx11::string::compare(&local_128.character);
                  if (iVar5 == 0) {
                    SVar9 = FIFO;
                    goto LAB_00115d4f;
                  }
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_d8,"unknown scheduler algorithm \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_128);
                  plVar6 = (long *)std::__cxx11::string::append(&local_d8.character);
                  psVar1 = (size_type *)(plVar6 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar6 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_108.field_2._M_allocated_capacity = *psVar1;
                    local_108.field_2._8_8_ = plVar6[3];
                    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                  }
                  else {
                    local_108.field_2._M_allocated_capacity = *psVar1;
                    local_108._M_dataplus._M_p = (pointer)*plVar6;
                  }
                  local_108._M_string_length = plVar6[1];
                  *plVar6 = (long)psVar1;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  llvm::Twine::Twine((Twine *)&local_b8,&local_108);
                  local_68.twine = (Twine *)0x0;
                  uStack_60 = 0;
                  llvm::SourceMgr::PrintMessage
                            (local_e0,(SMLoc)0x0,DK_Error,(Twine *)&local_b8,
                             (ArrayRef<llvm::SMRange>)ZEXT816(0),(ArrayRef<llvm::SMFixIt>)ZEXT816(0)
                             ,true);
                  this->hadErrors = true;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p != &local_108.field_2) {
                    operator_delete(local_108._M_dataplus._M_p,
                                    local_108.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d8.twine != &local_c8) {
                    operator_delete(local_d8.twine,local_c8._M_allocated_capacity + 1);
                  }
                  bVar4 = true;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_128.twine != &local_118) {
                  operator_delete(local_128.twine,local_118._M_allocated_capacity + 1);
                }
                __x = __x_00;
                sVar11 = sVar13;
                if (bVar4) {
                  return;
                }
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)__x);
                if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)__x), iVar5 == 0)
                   ) {
                  if (sVar13 != 0) {
                    lVar7 = strtol((__x_00->_M_dataplus)._M_p,&local_70,10);
                    this->schedulerLanes = (uint32_t)lVar7;
                    if (*local_70 != '\0') {
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&local_b8,"invalid argument \'",__x_00);
                      plVar6 = (long *)std::__cxx11::string::append(&local_b8.character);
                      local_d8.twine = (Twine *)&local_c8;
                      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(plVar6 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar6 == paVar10) {
                        local_c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
                        local_c8._8_8_ = plVar6[3];
                      }
                      else {
                        local_c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
                        local_d8.twine = (Twine *)*plVar6;
                      }
                      local_d0 = plVar6[1];
                      *plVar6 = (long)paVar10;
                      plVar6[1] = 0;
                      *(undefined1 *)(plVar6 + 2) = 0;
                      std::operator+(&local_108,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&local_d8,__x);
                      plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
                      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(plVar6 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar6 == paVar10) {
                        local_118._M_allocated_capacity = paVar10->_M_allocated_capacity;
                        local_118._8_8_ = plVar6[3];
                        local_128.twine = (Twine *)&local_118;
                      }
                      else {
                        local_118._M_allocated_capacity = paVar10->_M_allocated_capacity;
                        local_128.twine = (Twine *)*plVar6;
                      }
                      local_120 = plVar6[1];
                      *plVar6 = (long)paVar10;
                      plVar6[1] = 0;
                      *(undefined1 *)(plVar6 + 2) = 0;
                      llvm::Twine::Twine((Twine *)&local_68,(string *)&local_128);
                      local_48 = 0;
                      uStack_40 = 0;
                      llvm::SourceMgr::PrintMessage
                                (local_e0,(SMLoc)0x0,DK_Error,(Twine *)&local_68,
                                 (ArrayRef<llvm::SMRange>)ZEXT816(0),
                                 (ArrayRef<llvm::SMFixIt>)ZEXT816(0),true);
                      this->hadErrors = true;
                      if (local_128.twine != (Twine *)&local_118) {
                        operator_delete(local_128.twine,local_118._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108._M_dataplus._M_p != &local_108.field_2) {
                        operator_delete(local_108._M_dataplus._M_p,
                                        local_108.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d8.twine != &local_c8) {
                        operator_delete(local_d8.twine,local_c8._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_b8.twine != &local_a8) {
                        operator_delete(local_b8.twine,local_a8._M_allocated_capacity + 1);
                      }
                    }
                    goto LAB_00115a59;
                  }
                  goto LAB_00115eeb;
                }
                if ((__x->_M_string_length < 2) ||
                   (psVar2 = (short *)(__x->_M_dataplus)._M_p, *psVar2 != 0x6a2d)) {
                  iVar5 = std::__cxx11::string::compare((char *)__x);
                  if ((iVar5 != 0) &&
                     (iVar5 = std::__cxx11::string::compare((char *)__x), iVar5 != 0)) {
                    iVar5 = std::__cxx11::string::compare((char *)__x);
                    if (iVar5 == 0) {
                      psVar12 = local_88;
                      if (sVar13 != 0) goto LAB_00115a51;
                      __lhs = "missing argument to \'";
                    }
                    else {
                      __lhs = "invalid option \'";
                    }
                    std::operator+(&local_108,__lhs,__x);
                    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_108);
                    local_128.twine = (Twine *)&local_118;
                    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(puVar8 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar8 == paVar10) {
                      local_118._M_allocated_capacity = paVar10->_M_allocated_capacity;
                      local_118._8_8_ = puVar8[3];
                    }
                    else {
                      local_118._M_allocated_capacity = paVar10->_M_allocated_capacity;
                      local_128.twine = (Twine *)*puVar8;
                    }
                    local_120 = puVar8[1];
                    *puVar8 = paVar10;
                    puVar8[1] = 0;
                    *(undefined1 *)(puVar8 + 2) = 0;
                    llvm::Twine::Twine((Twine *)&local_d8,(string *)&local_128);
                    local_b8.twine = (Twine *)0x0;
                    uStack_b0 = 0;
                    llvm::SourceMgr::PrintMessage
                              (local_e0,(SMLoc)0x0,DK_Error,(Twine *)&local_d8,
                               (ArrayRef<llvm::SMRange>)ZEXT816(0),
                               (ArrayRef<llvm::SMFixIt>)ZEXT816(0),true);
                    this->hadErrors = true;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_128.twine == &local_118) goto LAB_00115fbc;
                    goto LAB_00115faf;
                  }
                  this->showVerboseStatus = true;
                  __x = __x_00;
                  sVar11 = sVar13;
                }
                else {
                  lVar7 = strtol((char *)(psVar2 + 1),&local_d8.cString,10);
                  this->schedulerLanes = (uint32_t)lVar7;
                  __x = __x_00;
                  sVar11 = sVar13;
                  if (*local_d8.cString != '\0') {
                    llvm::Twine::Twine((Twine *)&local_128,"invalid argument to \'-j\'");
                    local_108._M_dataplus._M_p = (pointer)0x0;
                    local_108._M_string_length = 0;
                    llvm::SourceMgr::PrintMessage
                              (local_e0,(SMLoc)0x0,DK_Error,(Twine *)&local_128,
                               (ArrayRef<llvm::SMRange>)ZEXT816(0),
                               (ArrayRef<llvm::SMFixIt>)ZEXT816(0),true);
                    this->hadErrors = true;
                  }
                }
              }
            }
          }
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->positionalArgs,__x);
        __x = __x_00;
        sVar11 = sVar13;
      }
    } while (sVar11 != 0);
  }
  return;
}

Assistant:

void BuildSystemInvocation::parse(llvm::ArrayRef<std::string> args,
                                  llvm::SourceMgr& sourceMgr) {
  auto error = [&](const Twine &message) {
    sourceMgr.PrintMessage(llvm::SMLoc{}, llvm::SourceMgr::DK_Error, message);
    hadErrors = true;
  };

  while (!args.empty()) {
    const auto& option = args.front();
    args = args.slice(1);

    if (option == "-") {
      for (const auto& arg: args) {
        positionalArgs.push_back(arg);
      }
      break;
    }

    if (!option.empty() && option[0] != '-') {
      positionalArgs.push_back(option);
      continue;
    }
    
    if (option == "--help") {
      showUsage = true;
      break;
    } else if (option == "--version") {
      showVersion = true;
      break;
    } else if (option == "--no-db") {
      dbPath = "";
    } else if (option == "--db") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      dbPath = args[0];
      args = args.slice(1);
    } else if (option == "-C" || option == "--chdir") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      chdirPath = args[0];
      args = args.slice(1);
    } else if (option == "-f") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      buildFilePath = args[0];
      args = args.slice(1);
    } else if (option == "--serial") {
      useSerialBuild = true;
    } else if (option == "--scheduler") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      auto algorithm = args[0];
      if (algorithm == "commandNamePriority" || algorithm == "default") {
        schedulerAlgorithm = SchedulerAlgorithm::NamePriority;
      } else if (algorithm == "fifo") {
        schedulerAlgorithm = SchedulerAlgorithm::FIFO;
      } else {
        error("unknown scheduler algorithm '" + algorithm + "'");
        break;
      }
      args = args.slice(1);
    } else if (option == "-j" || option == "--jobs") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      char *end;
      schedulerLanes = ::strtol(args[0].c_str(), &end, 10);
      if (*end != '\0') {
        error("invalid argument '" + args[0] + "' to '" + option + "'");
      }
      args = args.slice(1);
    } else if (StringRef(option).startswith("-j")) {
      char *end;
      schedulerLanes = ::strtol(&option[2], &end, 10);
      if (*end != '\0') {
        error("invalid argument to '-j'");
      }
    } else if (option == "-v" || option == "--verbose") {
      showVerboseStatus = true;
    } else if (option == "--trace") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      traceFilePath = args[0];
      args = args.slice(1);
    } else {
      error("invalid option '" + option + "'");
      break;
    }
  }
}